

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

int __thiscall Liby::Buffer::copy(Buffer *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Buffer *that_local;
  Buffer *this_local;
  
  if (this != (Buffer *)dst) {
    resetBuffer(this);
    this->buffer_ = *(char **)dst;
    *(undefined8 *)dst = 0;
    this->leftIndex_ = *(off_t *)(dst + 8);
    this->rightIndex_ = *(off_t *)(dst + 0x10);
    this->capacity_ = *(off_t *)(dst + 0x18);
  }
  return (int)this;
}

Assistant:

void Buffer::copy(Buffer &that) {
    if (this == &that)
        return;
    resetBuffer();
    buffer_ = that.buffer_;
    that.buffer_ = nullptr;
    leftIndex_ = that.leftIndex_;
    rightIndex_ = that.rightIndex_;
    capacity_ = that.capacity_;
}